

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_glibc.c
# Opt level: O0

void * adksys_get_public_adiak_symbol(void)

{
  long lVar1;
  void *result;
  
  dlerror();
  result = (void *)dlsym(0,"adiak_public");
  lVar1 = dlerror();
  if (lVar1 != 0) {
    result = (void *)0x0;
  }
  return result;
}

Assistant:

void *adksys_get_public_adiak_symbol()
{
   void *result;
   
   dlerror();
   result = dlsym(RTLD_DEFAULT, "adiak_public");
   if (dlerror())
      return NULL;
   return result;
}